

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O2

long ply_set_read_cb(p_ply ply,char *element_name,char *property_name,p_ply_read_cb read_cb,
                    void *pdata,long idata)

{
  p_ply_element ptVar1;
  p_ply_property ptVar2;
  p_ply_property ptVar3;
  p_ply_element ptVar4;
  int iVar5;
  p_ply_element __s1;
  p_ply_property __s1_00;
  long lVar6;
  ulong uVar7;
  
  if (((ply == (p_ply)0x0) || (element_name == (char *)0x0)) || (property_name == (char *)0x0)) {
    __assert_fail("ply && element_name && property_name",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x1b1,
                  "long ply_set_read_cb(p_ply, const char *, const char *, p_ply_read_cb, void *, long)"
                 );
  }
  ptVar1 = ply->element;
  iVar5 = (int)ply->nelements;
  if (iVar5 != 0 && ptVar1 == (p_ply_element)0x0) {
    __assert_fail("element || nelements == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x39e,"p_ply_element ply_find_element(p_ply, const char *)");
  }
  if (iVar5 < 1 && ptVar1 != (p_ply_element)0x0) {
    __assert_fail("!element || nelements > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                  ,0x39f,"p_ply_element ply_find_element(p_ply, const char *)");
  }
  uVar7 = ply->nelements & 0xffffffff;
  if (iVar5 < 1) {
    uVar7 = 0;
  }
  lVar6 = uVar7 + 1;
  ptVar4 = ptVar1;
  do {
    __s1 = ptVar4;
    lVar6 = lVar6 + -1;
    if (lVar6 == 0) {
      return 0;
    }
    iVar5 = strcmp(__s1->name,element_name);
    ptVar4 = __s1 + 1;
  } while (iVar5 != 0);
  if (ptVar1 != (p_ply_element)0x0) {
    ptVar2 = __s1->property;
    iVar5 = (int)__s1->nproperties;
    if (iVar5 != 0 && ptVar2 == (p_ply_property)0x0) {
      __assert_fail("property || nproperties == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                    ,0x3ac,"p_ply_property ply_find_property(p_ply_element, const char *)");
    }
    if (iVar5 < 1 && ptVar2 != (p_ply_property)0x0) {
      __assert_fail("!property || nproperties > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                    ,0x3ad,"p_ply_property ply_find_property(p_ply_element, const char *)");
    }
    uVar7 = __s1->nproperties & 0xffffffff;
    if (iVar5 < 1) {
      uVar7 = 0;
    }
    lVar6 = uVar7 + 1;
    ptVar3 = ptVar2;
    do {
      __s1_00 = ptVar3;
      lVar6 = lVar6 + -1;
      if (lVar6 == 0) {
        return 0;
      }
      iVar5 = strcmp(__s1_00->name,property_name);
      ptVar3 = __s1_00 + 1;
    } while (iVar5 != 0);
    if (ptVar2 != (p_ply_property)0x0) {
      __s1_00->read_cb = read_cb;
      __s1_00->pdata = pdata;
      __s1_00->idata = idata;
      return (long)(int)__s1->ninstances;
    }
  }
  return 0;
}

Assistant:

long ply_set_read_cb(p_ply ply, const char *element_name,
        const char* property_name, p_ply_read_cb read_cb,
        void *pdata, long idata) {
    p_ply_element element = NULL;
    p_ply_property property = NULL;
    assert(ply && element_name && property_name);
    element = ply_find_element(ply, element_name);
    if (!element) return 0;
    property = ply_find_property(element, property_name);
    if (!property) return 0;
    property->read_cb = read_cb;
    property->pdata = pdata;
    property->idata = idata;
    return (int) element->ninstances;
}